

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::GetStructMemberTypes
          (ValidationState_t *this,uint32_t struct_type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *member_types)

{
  pointer puVar1;
  long *plVar2;
  pointer puVar3;
  const_iterator cVar4;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  
  puVar1 = (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (struct_type_id != 0) {
    local_38 = (pointer)CONCAT44(local_38._4_4_,struct_type_id);
    cVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->all_definitions_)._M_h,(key_type_conflict *)&local_38);
    if ((cVar4.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (plVar2 = *(long **)((long)cVar4.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                  ._M_cur + 0x10), plVar2 == (long *)0x0)) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4a9,
                    "bool spvtools::val::ValidationState_t::GetStructMemberTypes(uint32_t, std::vector<uint32_t> *) const"
                   );
    }
    if (*(short *)((long)plVar2 + 0x3a) == 0x1e) {
      local_28 = (pointer)0x0;
      local_38 = (pointer)0x0;
      puStack_30 = (pointer)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,*plVar2 + 8,
                 plVar2[1]);
      puVar1 = (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = local_38;
      (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puStack_30;
      (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_28;
      local_28 = (pointer)0x0;
      local_38 = (pointer)0x0;
      puStack_30 = (pointer)0x0;
      if ((puVar1 != (pointer)0x0) &&
         (operator_delete(puVar1,(long)puVar3 - (long)puVar1), local_38 != (pointer)0x0)) {
        operator_delete(local_38,(long)local_28 - (long)local_38);
      }
      return (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start !=
             (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::GetStructMemberTypes(
    uint32_t struct_type_id, std::vector<uint32_t>* member_types) const {
  member_types->clear();
  if (!struct_type_id) return false;

  const Instruction* inst = FindDef(struct_type_id);
  assert(inst);
  if (inst->opcode() != spv::Op::OpTypeStruct) return false;

  *member_types =
      std::vector<uint32_t>(inst->words().cbegin() + 2, inst->words().cend());

  if (member_types->empty()) return false;

  return true;
}